

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O0

int __thiscall diy::mpi::status::count(status *this,datatype *type)

{
  MPI_Status *pMVar1;
  MPI_Datatype *ppoVar2;
  DIY_MPI_Datatype *in_RSI;
  DIY_MPI_Status *in_RDI;
  int c;
  int local_14;
  DIY_MPI_Datatype *local_10;
  
  local_10 = in_RSI;
  pMVar1 = mpi_cast(in_RDI);
  ppoVar2 = mpi_cast(local_10);
  MPI_Get_count(pMVar1,*ppoVar2,&local_14);
  return local_14;
}

Assistant:

int diy::mpi::status::count(const diy::mpi::datatype& type) const
{
#if DIY_HAS_MPI
  int c;
  MPI_Get_count(&mpi_cast(handle), mpi_cast(type.handle), &c);
  return c;
#else
  (void) type;
  DIY_UNSUPPORTED_MPI_CALL(diy::mpi::status::count);
#endif
}